

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::caseAllowed
          (SparseTexture2CommitmentTestCase *this,GLint target,GLint format)

{
  bool bVar1;
  
  if (((target & 0xfffffffdU) != 0x9100) ||
     (((bVar1 = false, format != 0x8c3d && (format != 0x8d62)) && (format != 0x906f)))) {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SparseTexture2CommitmentTestCase::caseAllowed(GLint target, GLint format)
{
	// Multisample textures are filling with data and verifying using compute shader.
	// As shaders do not support some texture formats it is necessary to exclude them.
	if ((target == GL_TEXTURE_2D_MULTISAMPLE || target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY) &&
		(format == GL_RGB565 || format == GL_RGB10_A2UI || format == GL_RGB9_E5))
	{
		return false;
	}

	return true;
}